

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O1

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::split
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this)

{
  DataFlowState copied;
  DataFlowState local_200;
  DataFlowState local_160;
  DataFlowState local_c0;
  
  if (this->isStateSplit == false) {
    DataFlowAnalysis::copyState(&local_c0,(DataFlowAnalysis *)this,&this->state);
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              (&local_160.assigned,(Base *)&local_c0);
    local_160.reachable = local_c0.reachable;
    SmallVector<slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_2UL>::SmallVector
              (&local_200.assigned,(Base *)&this->state);
    local_200.reachable = (this->state).reachable;
    setConditionalState(this,&local_160,&local_200);
    if (local_200.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
        (pointer)local_200.assigned.
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                 firstElement) {
      operator_delete(local_200.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      data_);
    }
    if (local_160.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
        (pointer)local_160.assigned.
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                 firstElement) {
      operator_delete(local_160.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      data_);
    }
    if (local_c0.assigned.
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ !=
        (pointer)local_c0.assigned.
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                 firstElement) {
      operator_delete(local_c0.assigned.
                      super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                      data_);
    }
  }
  return;
}

Assistant:

void split() {
        if (!isStateSplit) {
            auto copied = (DERIVED).copyState(state);
            setConditionalState(std::move(copied), std::move(state));
        }
    }